

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::base::VRegistry::setFromArgs(VRegistry *this,CommandLineArgs *commandLineArgs)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  bVar1 = utils::CommandLineArgs::hasParam(commandLineArgs,"-v");
  if ((((bVar1) || (bVar1 = utils::CommandLineArgs::hasParam(commandLineArgs,"--verbose"), bVar1))
      || (bVar1 = utils::CommandLineArgs::hasParam(commandLineArgs,"-V"), bVar1)) ||
     (bVar1 = utils::CommandLineArgs::hasParam(commandLineArgs,"--VERBOSE"), bVar1)) {
    (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])(this);
  }
  else {
    bVar1 = utils::CommandLineArgs::hasParamWithValue(commandLineArgs,"--v");
    if (bVar1) {
      pcVar3 = "--v";
    }
    else {
      bVar1 = utils::CommandLineArgs::hasParamWithValue(commandLineArgs,"--V");
      if (!bVar1) {
        bVar1 = utils::CommandLineArgs::hasParamWithValue(commandLineArgs,"-vmodule");
        if ((bVar1) && ((*this->m_pFlags & 0x200) == 0)) {
          pcVar3 = "-vmodule";
        }
        else {
          bVar1 = utils::CommandLineArgs::hasParamWithValue(commandLineArgs,"-VMODULE");
          if (!bVar1) {
            return;
          }
          if ((*this->m_pFlags & 0x200) != 0) {
            return;
          }
          pcVar3 = "-VMODULE";
        }
        pcVar3 = utils::CommandLineArgs::getParamValue(commandLineArgs,pcVar3);
        setModules(this,pcVar3);
        return;
      }
      pcVar3 = "--V";
    }
    pcVar3 = utils::CommandLineArgs::getParamValue(commandLineArgs,pcVar3);
    iVar2 = atoi(pcVar3);
    (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])(this);
    if ((ushort)iVar2 < 10) {
      *(ushort *)&(this->super_ThreadSafe).field_0xa = (ushort)iVar2;
      return;
    }
  }
  *(undefined2 *)&(this->super_ThreadSafe).field_0xa = 9;
  return;
}

Assistant:

void VRegistry::setFromArgs(const base::utils::CommandLineArgs* commandLineArgs) {
  if (commandLineArgs->hasParam("-v") || commandLineArgs->hasParam("--verbose") ||
      commandLineArgs->hasParam("-V") || commandLineArgs->hasParam("--VERBOSE")) {
    setLevel(base::consts::kMaxVerboseLevel);
  } else if (commandLineArgs->hasParamWithValue("--v")) {
    setLevel(static_cast<base::type::VerboseLevel>(atoi(commandLineArgs->getParamValue("--v"))));
  } else if (commandLineArgs->hasParamWithValue("--V")) {
    setLevel(static_cast<base::type::VerboseLevel>(atoi(commandLineArgs->getParamValue("--V"))));
  } else if ((commandLineArgs->hasParamWithValue("-vmodule")) && vModulesEnabled()) {
    setModules(commandLineArgs->getParamValue("-vmodule"));
  } else if (commandLineArgs->hasParamWithValue("-VMODULE") && vModulesEnabled()) {
    setModules(commandLineArgs->getParamValue("-VMODULE"));
  }
}